

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::compiler::Version::_InternalParse(Version *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  ulong uVar2;
  internal *this_00;
  char *size;
  bool bVar3;
  string *s;
  uint uVar4;
  char *field_name;
  char cVar5;
  uint uVar6;
  undefined8 *puVar7;
  UnknownFieldSet *unknown;
  byte *p;
  uint uVar8;
  StringPiece str;
  pair<const_char_*,_unsigned_int> pVar9;
  byte *local_48;
  InternalMetadata *local_40;
  ArenaStringPtr *local_38;
  
  local_48 = (byte *)ptr;
  bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
  uVar8 = 0;
  if (!bVar3) {
    local_40 = &(this->super_Message).super_MessageLite._internal_metadata_;
    local_38 = &this->suffix_;
    uVar8 = 0;
    do {
      bVar1 = *local_48;
      uVar6 = (uint)bVar1;
      p = local_48 + 1;
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar9 = internal::ReadTagFallback((char *)local_48,uVar6);
          p = (byte *)pVar9.first;
          uVar6 = pVar9.second;
        }
        else {
          p = local_48 + 2;
        }
      }
      uVar4 = (uVar6 >> 3) - 1;
      local_48 = p;
      if (3 < uVar4) {
switchD_0028186a_default:
        if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
          if (p != (byte *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
            break;
          }
        }
        else {
          if ((local_40->ptr_ & 1U) == 0) {
            unknown = internal::InternalMetadata::
                      mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(local_40);
          }
          else {
            unknown = (UnknownFieldSet *)((local_40->ptr_ & 0xfffffffffffffffcU) + 8);
          }
          local_48 = (byte *)internal::UnknownFieldParse((ulong)uVar6,unknown,(char *)local_48,ctx);
joined_r0x0028195b:
          if (local_48 != (byte *)0x0) goto LAB_002819eb;
        }
        local_48 = (byte *)0x0;
        break;
      }
      field_name = (char *)((long)&switchD_0028186a::switchdataD_003ea5ec +
                           (long)(int)(&switchD_0028186a::switchdataD_003ea5ec)[uVar4]);
      cVar5 = (char)uVar6;
      switch(uVar6 >> 3) {
      case 1:
        if (cVar5 != '\b') goto switchD_0028186a_default;
        uVar8 = uVar8 | 2;
        bVar1 = *p;
        uVar6 = (uint)bVar1;
        local_48 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
          if ((char)*local_48 < '\0') {
            local_48 = p;
            pVar9 = internal::VarintParseSlow32((char *)p,uVar6);
            local_48 = (byte *)pVar9.first;
            this->major_ = pVar9.second;
            goto joined_r0x0028195b;
          }
          local_48 = p + 2;
        }
        this->major_ = uVar6;
        break;
      case 2:
        if (cVar5 != '\x10') goto switchD_0028186a_default;
        uVar8 = uVar8 | 4;
        bVar1 = *p;
        uVar6 = (uint)bVar1;
        local_48 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
          if ((char)*local_48 < '\0') {
            local_48 = p;
            pVar9 = internal::VarintParseSlow32((char *)p,uVar6);
            local_48 = (byte *)pVar9.first;
            this->minor_ = pVar9.second;
            goto joined_r0x0028195b;
          }
          local_48 = p + 2;
        }
        this->minor_ = uVar6;
        break;
      case 3:
        if (cVar5 != '\x18') goto switchD_0028186a_default;
        uVar8 = uVar8 | 8;
        bVar1 = *p;
        uVar6 = (uint)bVar1;
        local_48 = p + 1;
        if ((char)bVar1 < '\0') {
          uVar6 = ((uint)bVar1 + (uint)*local_48 * 0x80) - 0x80;
          if ((char)*local_48 < '\0') {
            local_48 = p;
            pVar9 = internal::VarintParseSlow32((char *)p,uVar6);
            local_48 = (byte *)pVar9.first;
            this->patch_ = pVar9.second;
            goto joined_r0x0028195b;
          }
          local_48 = p + 2;
        }
        this->patch_ = uVar6;
        break;
      case 4:
        if (cVar5 != '\"') goto switchD_0028186a_default;
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
        puVar7 = (undefined8 *)(uVar2 & 0xfffffffffffffffc);
        if ((uVar2 & 1) != 0) {
          puVar7 = (undefined8 *)*puVar7;
        }
        s = internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar7);
        local_48 = (byte *)internal::InlineGreedyStringParser(s,(char *)local_48,ctx);
        this_00 = (internal *)(s->_M_dataplus)._M_p;
        size = (char *)s->_M_string_length;
        if ((long)size < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)size,"string length exceeds max size");
        }
        str.length_ = (size_type)"google.protobuf.compiler.Version.suffix";
        str.ptr_ = size;
        internal::VerifyUTF8(this_00,str,field_name);
        goto joined_r0x0028195b;
      }
LAB_002819eb:
      bVar3 = internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_48,ctx->group_depth_);
    } while (!bVar3);
  }
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar8;
  return (char *)local_48;
}

Assistant:

const char* Version::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional int32 major = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          _Internal::set_has_major(&has_bits);
          major_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 minor = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_minor(&has_bits);
          minor_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional int32 patch = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 24)) {
          _Internal::set_has_patch(&has_bits);
          patch_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint32(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional string suffix = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          auto str = _internal_mutable_suffix();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.Version.suffix");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}